

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O3

int cmd_init(char *args)

{
  int iVar1;
  size_t sVar2;
  undefined8 uVar3;
  char *__s;
  
  __s = args;
  if (*args == '\"') {
    __s = args + 1;
    sVar2 = strlen(__s);
    args[sVar2] = '\0';
  }
  iVar1 = PHYSFS_init(__s);
  if (iVar1 == 0) {
    uVar3 = PHYSFS_getLastError();
    printf("Failure. reason: %s.\n",uVar3);
  }
  else {
    puts("Successful.");
  }
  return 1;
}

Assistant:

static int cmd_init(char *args)
{
    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    if (PHYSFS_init(args))
        printf("Successful.\n");
    else
        printf("Failure. reason: %s.\n", PHYSFS_getLastError());

    return 1;
}